

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O0

void __thiscall
TPZSubMeshAnalysis::SetCompMesh
          (TPZSubMeshAnalysis *this,TPZCompMesh *mesh,bool mustOptimizeBandwidth)

{
  byte bVar1;
  byte in_DL;
  TPZCompMesh *in_RSI;
  long in_RDI;
  TPZSubCompMesh *submesh;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  TPZCompMesh *in_stack_ffffffffffffffb8;
  TPZAnalysis *in_stack_ffffffffffffffc0;
  long local_38;
  undefined7 in_stack_ffffffffffffffe8;
  TPZCompMesh *pTVar2;
  
  bVar1 = in_DL & 1;
  pTVar2 = in_RSI;
  if (in_RSI == (TPZCompMesh *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(in_RSI,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
  }
  if (local_38 == 0) {
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  else {
    *(long *)(in_RDI + 0x520) = local_38;
  }
  TPZAnalysis::SetCompMesh(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false);
  if (*(long *)(in_RDI + 0x10) != 0) {
    TPZCompMesh::NEquations(pTVar2);
    TPZFMatrix<double>::Redim
              ((TPZFMatrix<double> *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),local_38,
               (int64_t)in_RSI);
  }
  return;
}

Assistant:

void TPZSubMeshAnalysis::SetCompMesh(TPZCompMesh * mesh, bool mustOptimizeBandwidth)
{
    TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(mesh);
    if (submesh) {
        fMesh = submesh;
    }
    else
    {
        DebugStop();
    }
    TPZLinearAnalysis::SetCompMesh(mesh, mustOptimizeBandwidth);
    if (fCompMesh) {
        fReferenceSolution.Redim(fCompMesh->NEquations(), 1);
    }
}